

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::deviceProperties(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  int iVar2;
  TestLog *pTVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  deUint32 ndx;
  InstanceInterface *pIVar8;
  VkPhysicalDevice pVVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  long lVar17;
  int *piVar18;
  float fVar19;
  ApiVersion AVar20;
  ApiVersion AVar21;
  deUint8 buffer [856];
  VkPhysicalDeviceFeatures features;
  undefined1 local_1ca8 [384];
  VkPhysicalDeviceProperties local_1b28;
  char acStack_17f0 [44];
  int local_17c4 [55];
  undefined1 local_16e8 [8];
  char *local_16e0;
  TestLog local_16d8;
  undefined4 uStack_16d0;
  undefined8 uStack_16cc;
  undefined8 local_16c4;
  int aiStack_16bc [3];
  char *local_16b0;
  undefined4 local_16a8;
  undefined8 local_16a4;
  undefined8 uStack_169c;
  undefined8 local_1694;
  undefined8 uStack_168c;
  char *local_1680;
  undefined4 local_1678;
  undefined8 local_1674;
  undefined8 uStack_166c;
  undefined8 local_1664;
  undefined8 uStack_165c;
  char *local_1650;
  undefined4 local_1648;
  undefined8 local_1644;
  undefined8 uStack_163c;
  undefined8 local_1634;
  undefined8 uStack_162c;
  char *local_1620;
  undefined4 local_1618;
  undefined8 local_1614;
  undefined8 uStack_160c;
  undefined8 local_1604;
  undefined8 uStack_15fc;
  char *local_15f0;
  undefined4 local_15e8;
  undefined8 local_15e4;
  undefined8 uStack_15dc;
  undefined8 local_15d4;
  undefined8 uStack_15cc;
  char *local_15c0;
  undefined4 local_15b8;
  undefined8 local_15b4;
  undefined8 uStack_15ac;
  undefined8 local_15a4;
  undefined8 uStack_159c;
  char *local_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined4 local_1578;
  undefined8 local_1574;
  undefined8 uStack_156c;
  char *local_1560;
  undefined4 local_1558;
  undefined8 local_1554;
  undefined8 uStack_154c;
  undefined8 local_1544;
  undefined8 uStack_153c;
  char *local_1530;
  undefined4 local_1528;
  undefined8 local_1524;
  undefined8 uStack_151c;
  undefined8 local_1514;
  undefined8 uStack_150c;
  char *local_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined4 local_14e8;
  undefined8 local_14e4;
  undefined8 uStack_14dc;
  char *local_14d0;
  undefined8 local_14c8;
  undefined8 local_14c0;
  undefined4 local_14b8;
  undefined8 local_14b4;
  undefined8 uStack_14ac;
  char *local_14a0;
  undefined8 local_1498;
  undefined8 local_1490;
  undefined4 local_1488;
  undefined8 local_1484;
  undefined8 uStack_147c;
  char *local_1470;
  undefined8 local_1468;
  undefined8 local_1460;
  undefined4 local_1458;
  undefined8 local_1454;
  undefined8 uStack_144c;
  char *local_1440;
  undefined4 local_1438;
  undefined8 local_1434;
  undefined8 uStack_142c;
  undefined8 local_1424;
  undefined8 uStack_141c;
  char *local_1410;
  undefined4 local_1408;
  undefined8 local_1404;
  undefined8 uStack_13fc;
  undefined8 local_13f4;
  undefined8 uStack_13ec;
  char *local_13e0;
  undefined4 local_13d8;
  undefined8 local_13d4;
  undefined8 uStack_13cc;
  undefined8 local_13c4;
  undefined8 uStack_13bc;
  char *local_13b0;
  undefined4 local_13a8;
  undefined8 local_13a4;
  undefined8 uStack_139c;
  undefined8 local_1394;
  undefined8 uStack_138c;
  char *local_1380;
  undefined4 local_1378;
  undefined8 local_1374;
  undefined8 uStack_136c;
  undefined8 local_1364;
  undefined8 uStack_135c;
  char *local_1350;
  undefined4 local_1348;
  undefined8 local_1344;
  undefined8 uStack_133c;
  undefined8 local_1334;
  undefined8 uStack_132c;
  char *local_1320;
  undefined4 local_1318;
  undefined8 local_1314;
  undefined8 uStack_130c;
  undefined8 local_1304;
  undefined8 uStack_12fc;
  char *local_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined4 local_12d8;
  undefined8 local_12d4;
  undefined8 uStack_12cc;
  char *local_12c0;
  undefined4 local_12b8;
  undefined8 local_12b4;
  undefined8 uStack_12ac;
  undefined8 local_12a4;
  undefined8 uStack_129c;
  char *local_1290;
  undefined4 local_1288;
  undefined8 local_1284;
  undefined8 uStack_127c;
  undefined8 local_1274;
  undefined8 uStack_126c;
  char *local_1260;
  undefined4 local_1258;
  undefined8 local_1254;
  undefined8 uStack_124c;
  undefined8 local_1244;
  undefined8 uStack_123c;
  char *local_1230;
  undefined4 local_1228;
  undefined8 local_1224;
  undefined8 uStack_121c;
  undefined8 local_1214;
  undefined8 uStack_120c;
  char *local_1200;
  undefined4 local_11f8;
  undefined8 local_11f4;
  undefined8 uStack_11ec;
  undefined8 local_11e4;
  undefined8 uStack_11dc;
  char *local_11d0;
  undefined4 local_11c8;
  undefined8 local_11c4;
  undefined8 uStack_11bc;
  undefined8 local_11b4;
  undefined8 uStack_11ac;
  char *local_11a0;
  undefined4 local_1198;
  undefined8 local_1194;
  undefined8 uStack_118c;
  undefined8 local_1184;
  undefined8 uStack_117c;
  char *local_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined4 local_1158;
  undefined8 local_1154;
  undefined8 uStack_114c;
  char *local_1140;
  undefined4 local_1138;
  undefined8 local_1134;
  undefined8 uStack_112c;
  undefined8 local_1124;
  undefined8 uStack_111c;
  char *local_1110;
  undefined4 local_1108;
  undefined8 local_1104;
  undefined8 uStack_10fc;
  undefined8 local_10f4;
  undefined8 uStack_10ec;
  char *local_10e0;
  undefined4 local_10d8;
  undefined8 local_10d4;
  undefined8 uStack_10cc;
  undefined8 local_10c4;
  undefined8 uStack_10bc;
  char *local_10b0;
  undefined4 local_10a8;
  undefined8 local_10a4;
  undefined8 uStack_109c;
  undefined8 local_1094;
  undefined8 uStack_108c;
  char *local_1080;
  undefined4 local_1078;
  undefined8 local_1074;
  undefined8 uStack_106c;
  undefined8 local_1064;
  undefined8 uStack_105c;
  char *local_1050;
  undefined4 local_1048;
  undefined8 local_1044;
  undefined8 uStack_103c;
  undefined8 local_1034;
  undefined8 uStack_102c;
  char *local_1020;
  undefined4 local_1018;
  undefined8 local_1014;
  undefined8 uStack_100c;
  undefined8 local_1004;
  undefined8 uStack_ffc;
  char *local_ff0;
  undefined4 local_fe8;
  undefined8 local_fe4;
  undefined8 uStack_fdc;
  undefined8 local_fd4;
  undefined8 uStack_fcc;
  char *local_fc0;
  undefined4 local_fb8;
  undefined8 local_fb4;
  undefined8 uStack_fac;
  undefined8 local_fa4;
  undefined8 uStack_f9c;
  char *local_f90;
  undefined4 local_f88;
  undefined8 local_f84;
  undefined8 uStack_f7c;
  undefined8 local_f74;
  undefined8 uStack_f6c;
  char *local_f60;
  undefined4 local_f58;
  undefined8 local_f54;
  undefined8 uStack_f4c;
  undefined8 local_f44;
  undefined8 uStack_f3c;
  char *local_f30;
  undefined4 local_f28;
  undefined8 local_f24;
  undefined8 uStack_f1c;
  undefined8 local_f14;
  undefined8 uStack_f0c;
  char *local_f00;
  undefined4 local_ef8;
  undefined8 local_ef4;
  undefined8 uStack_eec;
  undefined8 local_ee4;
  undefined8 uStack_edc;
  char *local_ed0;
  undefined4 local_ec8;
  undefined8 local_ec4;
  undefined8 uStack_ebc;
  undefined8 local_eb4;
  undefined8 uStack_eac;
  char *local_ea0;
  undefined4 local_e98;
  undefined8 local_e94;
  undefined8 uStack_e8c;
  undefined8 local_e84;
  undefined8 uStack_e7c;
  char *local_e70;
  undefined4 local_e68;
  undefined8 local_e64;
  undefined8 uStack_e5c;
  undefined8 local_e54;
  undefined8 uStack_e4c;
  char *local_e40;
  undefined4 local_e38;
  undefined8 local_e34;
  undefined8 uStack_e2c;
  undefined8 local_e24;
  undefined8 uStack_e1c;
  char *local_e10;
  undefined4 local_e08;
  undefined8 local_e04;
  undefined8 uStack_dfc;
  undefined8 local_df4;
  undefined8 uStack_dec;
  char *local_de0;
  undefined4 local_dd8;
  undefined8 local_dd4;
  undefined8 uStack_dcc;
  undefined8 local_dc4;
  undefined8 uStack_dbc;
  char *local_db0;
  undefined4 local_da8;
  undefined8 local_da4;
  undefined8 uStack_d9c;
  undefined8 local_d94;
  undefined8 uStack_d8c;
  char *local_d80;
  undefined4 local_d78;
  undefined8 local_d74;
  undefined8 uStack_d6c;
  undefined8 local_d64;
  undefined8 uStack_d5c;
  char *local_d50;
  undefined4 local_d48;
  undefined8 local_d44;
  undefined8 uStack_d3c;
  undefined8 local_d34;
  undefined8 uStack_d2c;
  char *local_d20;
  undefined4 local_d18;
  undefined8 local_d14;
  undefined8 uStack_d0c;
  undefined8 local_d04;
  undefined8 uStack_cfc;
  char *local_cf0;
  undefined4 local_ce8;
  undefined8 local_ce4;
  undefined8 uStack_cdc;
  undefined8 local_cd4;
  undefined8 uStack_ccc;
  char *local_cc0;
  undefined4 local_cb8;
  undefined8 local_cb4;
  undefined8 uStack_cac;
  undefined8 local_ca4;
  undefined8 uStack_c9c;
  char *local_c90;
  undefined4 local_c88;
  undefined8 local_c84;
  undefined8 uStack_c7c;
  undefined8 local_c74;
  undefined8 uStack_c6c;
  char *local_c60;
  undefined4 local_c58;
  undefined8 local_c54;
  undefined8 uStack_c4c;
  undefined8 local_c44;
  undefined8 uStack_c3c;
  char *local_c30;
  undefined4 local_c28;
  undefined8 local_c24;
  undefined8 uStack_c1c;
  undefined8 local_c14;
  undefined8 uStack_c0c;
  char *local_c00;
  undefined4 local_bf8;
  undefined8 local_bf4;
  undefined8 uStack_bec;
  undefined8 local_be4;
  undefined8 uStack_bdc;
  char *local_bd0;
  undefined4 local_bc8;
  undefined8 local_bc4;
  undefined8 uStack_bbc;
  undefined8 local_bb4;
  undefined8 uStack_bac;
  char *local_ba0;
  undefined4 local_b98;
  undefined8 local_b94;
  undefined8 uStack_b8c;
  undefined8 local_b84;
  undefined8 uStack_b7c;
  char *local_b70;
  undefined4 local_b68;
  undefined8 local_b64;
  undefined8 uStack_b5c;
  undefined8 local_b54;
  undefined8 uStack_b4c;
  char *local_b40;
  undefined4 local_b38;
  undefined8 local_b34;
  undefined8 uStack_b2c;
  undefined8 local_b24;
  undefined8 uStack_b1c;
  char *local_b10;
  undefined4 local_b08;
  undefined8 local_b04;
  undefined8 uStack_afc;
  undefined8 local_af4;
  undefined8 uStack_aec;
  char *local_ae0;
  undefined4 local_ad8;
  undefined8 local_ad4;
  undefined8 uStack_acc;
  undefined8 local_ac4;
  undefined8 uStack_abc;
  char *local_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined4 local_a98;
  undefined8 local_a94;
  undefined8 uStack_a8c;
  char *local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined4 local_a68;
  undefined8 local_a64;
  undefined8 uStack_a5c;
  char *local_a50;
  undefined4 local_a48;
  undefined8 local_a44;
  undefined8 uStack_a3c;
  undefined8 local_a34;
  undefined8 uStack_a2c;
  char *local_a20;
  undefined4 local_a18;
  undefined8 local_a14;
  undefined8 uStack_a0c;
  undefined8 local_a04;
  undefined8 uStack_9fc;
  char *local_9f0;
  undefined4 local_9e8;
  undefined8 local_9e4;
  undefined8 uStack_9dc;
  undefined8 local_9d4;
  undefined8 uStack_9cc;
  char *local_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined4 local_9a8;
  undefined8 local_9a4;
  undefined8 uStack_99c;
  char *local_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined4 local_978;
  undefined8 local_974;
  undefined8 uStack_96c;
  char *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined4 local_948;
  undefined8 local_944;
  undefined8 uStack_93c;
  char *local_930;
  undefined4 local_928;
  undefined8 local_924;
  undefined8 uStack_91c;
  undefined8 local_914;
  undefined8 uStack_90c;
  char *local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined4 local_8e8;
  undefined8 local_8e4;
  undefined8 uStack_8dc;
  char *local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  undefined8 local_8b4;
  undefined8 uStack_8ac;
  char *local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined4 local_888;
  undefined8 local_884;
  undefined8 uStack_87c;
  char *local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined4 local_858;
  undefined8 local_854;
  undefined8 uStack_84c;
  char *local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined4 local_828;
  undefined8 local_824;
  undefined8 uStack_81c;
  char *local_810;
  undefined8 local_808;
  undefined8 local_800;
  undefined4 local_7f8;
  undefined8 local_7f4;
  undefined8 uStack_7ec;
  char *local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined4 local_7b8;
  char *local_7b0;
  undefined4 local_7a8;
  undefined8 local_7a4;
  undefined8 uStack_79c;
  undefined8 local_794;
  undefined8 uStack_78c;
  char *local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined4 local_758;
  char *local_750;
  undefined4 local_748;
  undefined8 local_744;
  undefined8 uStack_73c;
  undefined8 local_734;
  undefined8 uStack_72c;
  char *local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined4 local_708;
  undefined8 local_704;
  undefined8 uStack_6fc;
  char *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  float local_6d8;
  undefined8 local_6d4;
  undefined8 uStack_6cc;
  char *local_6c0;
  undefined4 local_6b8;
  undefined8 local_6b4;
  undefined8 uStack_6ac;
  undefined8 local_6a4;
  undefined8 uStack_69c;
  char *local_690;
  undefined4 local_688;
  undefined8 local_684;
  undefined8 uStack_67c;
  undefined8 local_674;
  undefined8 uStack_66c;
  char *local_660;
  undefined4 local_658;
  undefined8 local_654;
  undefined8 uStack_64c;
  undefined8 local_644;
  undefined8 uStack_63c;
  char *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined4 local_618;
  undefined8 local_614;
  undefined8 uStack_60c;
  char *local_600;
  undefined4 local_5f8;
  undefined8 local_5f4;
  undefined8 uStack_5ec;
  undefined8 local_5e4;
  undefined8 uStack_5dc;
  char *local_5d0;
  undefined4 local_5c8;
  undefined8 local_5c4;
  undefined8 uStack_5bc;
  undefined8 local_5b4;
  undefined8 uStack_5ac;
  char *local_5a0;
  undefined4 local_598;
  undefined8 local_594;
  undefined8 uStack_58c;
  undefined8 local_584;
  undefined8 uStack_57c;
  char *local_570;
  undefined4 local_568;
  undefined8 local_564;
  undefined8 uStack_55c;
  undefined8 local_554;
  undefined8 uStack_54c;
  char *local_540;
  undefined4 local_538;
  undefined8 local_534;
  undefined8 uStack_52c;
  undefined8 local_524;
  undefined8 uStack_51c;
  char *local_510;
  undefined4 local_508;
  undefined8 local_504;
  undefined8 uStack_4fc;
  undefined8 local_4f4;
  undefined8 uStack_4ec;
  char *local_4e0;
  undefined4 local_4d8;
  undefined8 local_4d4;
  undefined8 uStack_4cc;
  undefined8 local_4c4;
  undefined8 uStack_4bc;
  char *local_4b0;
  undefined4 local_4a8;
  undefined8 local_4a4;
  undefined8 uStack_49c;
  undefined8 local_494;
  undefined8 uStack_48c;
  char *local_480;
  undefined4 local_478;
  undefined8 local_474;
  undefined8 uStack_46c;
  undefined8 local_464;
  undefined8 uStack_45c;
  char *local_450;
  undefined4 local_448;
  undefined8 local_444;
  undefined8 uStack_43c;
  undefined8 local_434;
  undefined8 uStack_42c;
  char *local_420;
  undefined4 local_418;
  undefined8 local_414;
  undefined8 uStack_40c;
  undefined8 local_404;
  undefined8 uStack_3fc;
  char *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined4 local_3d8;
  undefined8 local_3d4;
  undefined8 uStack_3cc;
  char *local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined4 local_3a8;
  undefined8 local_3a4;
  undefined8 uStack_39c;
  char *local_390;
  undefined4 local_388;
  undefined8 local_384;
  undefined8 uStack_37c;
  undefined8 local_374;
  undefined8 uStack_36c;
  char *local_360;
  undefined4 local_358;
  undefined8 local_354;
  undefined8 uStack_34c;
  undefined8 local_344;
  undefined8 uStack_33c;
  char *local_330;
  undefined4 local_328;
  undefined8 local_324;
  undefined8 uStack_31c;
  undefined8 local_314;
  undefined8 uStack_30c;
  char *local_300;
  undefined4 local_2f8;
  undefined8 local_2f4;
  undefined8 uStack_2ec;
  undefined8 local_2e4;
  undefined8 uStack_2dc;
  char *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined4 local_2b8;
  undefined8 local_2b4;
  undefined8 uStack_2ac;
  char *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  undefined8 local_284;
  undefined8 uStack_27c;
  char *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  undefined8 local_254;
  undefined8 uStack_24c;
  char *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined4 local_228;
  undefined8 local_224;
  undefined8 uStack_21c;
  char *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined4 local_1f8;
  undefined8 local_1f4;
  undefined8 uStack_1ec;
  char *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8;
  undefined8 local_1c4;
  undefined8 uStack_1bc;
  char *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  undefined8 local_194;
  undefined8 uStack_18c;
  char *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  undefined8 local_164;
  undefined8 uStack_15c;
  char *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined8 local_134;
  undefined8 uStack_12c;
  char *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  undefined8 local_104;
  undefined8 uStack_fc;
  char *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_d4;
  undefined8 uStack_cc;
  char *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  char *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pTVar3 = context->m_testCtx->m_log;
  memset(&local_1b28,0xcd,0x358);
  pIVar8 = Context::getInstanceInterface(context);
  pVVar9 = Context::getPhysicalDevice(context);
  (*pIVar8->_vptr_InstanceInterface[5])(pIVar8,pVVar9,&local_1b28);
  pIVar8 = Context::getInstanceInterface(context);
  pVVar9 = Context::getPhysicalDevice(context);
  (*pIVar8->_vptr_InstanceInterface[2])(pIVar8,pVVar9,local_17c4);
  poVar1 = (ostringstream *)(local_1ca8 + 8);
  local_1ca8._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"device = ",9);
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(poVar1);
  local_16e8 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_16e0);
  ::vk::operator<<((ostream *)&local_16e0,&local_1b28);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_16e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_16e0);
  std::ios_base::~ios_base((ios_base *)((long)&local_1674 + 4));
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1ca8 + 0x78));
  local_16e8 = (undefined1  [8])((ulong)local_16e8 & 0xffffffff00000000);
  local_16e0 = "maxImageDimension1D";
  local_16d8.m_log._0_4_ = 0x1000;
  local_16d8.m_log._4_4_ = 0;
  uStack_16d0 = 0;
  uStack_16cc = 0;
  local_16c4 = 1;
  aiStack_16bc[0] = 0xffffffff;
  aiStack_16bc[1] = 4;
  local_16b0 = "maxImageDimension2D";
  local_16a8 = 0x1000;
  local_16a4 = 0;
  uStack_169c = 0;
  local_1694 = 1;
  uStack_168c = 0x8ffffffff;
  local_1680 = "maxImageDimension3D";
  local_1678 = 0x100;
  local_1674 = 0;
  uStack_166c = 0;
  local_1664 = 1;
  uStack_165c = 0xcffffffff;
  local_1650 = "maxImageDimensionCube";
  local_1648 = 0x1000;
  local_1644 = 0;
  uStack_163c = 0;
  local_1634 = 1;
  uStack_162c = 0x10ffffffff;
  local_1620 = "maxImageArrayLayers";
  local_1618 = 0x100;
  local_1614 = 0;
  uStack_160c = 0;
  local_1604 = 1;
  uStack_15fc = 0x14ffffffff;
  local_15f0 = "maxTexelBufferElements";
  local_15e8 = 0x10000;
  local_15e4 = 0;
  uStack_15dc = 0;
  local_15d4 = 1;
  uStack_15cc = 0x18ffffffff;
  local_15c0 = "maxUniformBufferRange";
  local_15b8 = 0x4000;
  local_15b4 = 0;
  uStack_15ac = 0;
  local_15a4 = 1;
  uStack_159c = 0x1cffffffff;
  local_1590 = "maxStorageBufferRange";
  local_1578 = 0;
  local_1588 = 0;
  uStack_1580 = 0;
  local_1574 = 0x200000001;
  uStack_156c = 0x20ffffffff;
  local_1560 = "maxPushConstantsSize";
  local_1558 = 0x80;
  local_1554 = 0;
  uStack_154c = 0;
  local_1544 = 1;
  uStack_153c = 0x24ffffffff;
  local_1530 = "maxMemoryAllocationCount";
  local_1528 = 0x1000;
  local_1524 = 0;
  uStack_151c = 0;
  local_1514 = 1;
  uStack_150c = 0x28ffffffff;
  local_1500 = "maxSamplerAllocationCount";
  local_14f8 = 0;
  uStack_14f0 = 0;
  local_14e8 = 0;
  local_14e4 = 0x200000001;
  uStack_14dc = 0x30ffffffff;
  local_14d0 = "bufferImageGranularity";
  local_14c8 = 0;
  local_14c0 = 1;
  local_14b8 = 0;
  local_14b4 = 3;
  uStack_14ac = 0x30ffffffff;
  local_14a0 = "bufferImageGranularity";
  local_1498 = 0;
  local_1490 = 0x20000;
  local_1488 = 0;
  local_1484 = 0x100000003;
  uStack_147c = 0x38ffffffff;
  local_1470 = "sparseAddressSpaceSize";
  local_1468 = 0;
  local_1460 = 0x80000000;
  local_1458 = 0;
  local_1454 = 3;
  uStack_144c = 0x40ffffffff;
  local_1440 = "maxBoundDescriptorSets";
  local_1438 = 4;
  local_1434 = 0;
  uStack_142c = 0;
  local_1424 = 1;
  uStack_141c = 0x44ffffffff;
  local_1410 = "maxPerStageDescriptorSamplers";
  local_1408 = 0x10;
  local_1404 = 0;
  uStack_13fc = 0;
  local_13f4 = 1;
  uStack_13ec = 0x48ffffffff;
  local_13e0 = "maxPerStageDescriptorUniformBuffers";
  local_13d8 = 0xc;
  local_13d4 = 0;
  uStack_13cc = 0;
  local_13c4 = 1;
  uStack_13bc = 0x4cffffffff;
  local_13b0 = "maxPerStageDescriptorStorageBuffers";
  local_13a8 = 4;
  local_13a4 = 0;
  uStack_139c = 0;
  local_1394 = 1;
  uStack_138c = 0x50ffffffff;
  local_1380 = "maxPerStageDescriptorSampledImages";
  local_1378 = 0x10;
  local_1374 = 0;
  uStack_136c = 0;
  local_1364 = 1;
  uStack_135c = 0x54ffffffff;
  local_1350 = "maxPerStageDescriptorStorageImages";
  local_1348 = 4;
  local_1344 = 0;
  uStack_133c = 0;
  local_1334 = 1;
  uStack_132c = 0x58ffffffff;
  local_1320 = "maxPerStageDescriptorInputAttachments";
  local_1318 = 4;
  local_1314 = 0;
  uStack_130c = 0;
  local_1304 = 1;
  uStack_12fc = 0x5cffffffff;
  local_12f0 = "maxPerStageResources";
  local_12d8 = 0;
  local_12e8 = 0;
  uStack_12e0 = 0;
  local_12d4 = 0x200000001;
  uStack_12cc = 0x60ffffffff;
  local_12c0 = "maxDescriptorSetSamplers";
  local_12b8 = 0x60;
  local_12b4 = 0;
  uStack_12ac = 0;
  local_12a4 = 1;
  uStack_129c = 0x64ffffffff;
  local_1290 = "maxDescriptorSetUniformBuffers";
  local_1288 = 0x48;
  local_1284 = 0;
  uStack_127c = 0;
  local_1274 = 1;
  uStack_126c = 0x68ffffffff;
  local_1260 = "maxDescriptorSetUniformBuffersDynamic";
  local_1258 = 8;
  local_1254 = 0;
  uStack_124c = 0;
  local_1244 = 1;
  uStack_123c = 0x6cffffffff;
  local_1230 = "maxDescriptorSetStorageBuffers";
  local_1228 = 0x18;
  local_1224 = 0;
  uStack_121c = 0;
  local_1214 = 1;
  uStack_120c = 0x70ffffffff;
  local_1200 = "maxDescriptorSetStorageBuffersDynamic";
  local_11f8 = 4;
  local_11f4 = 0;
  uStack_11ec = 0;
  local_11e4 = 1;
  uStack_11dc = 0x74ffffffff;
  local_11d0 = "maxDescriptorSetSampledImages";
  local_11c8 = 0x60;
  local_11c4 = 0;
  uStack_11bc = 0;
  local_11b4 = 1;
  uStack_11ac = 0x78ffffffff;
  local_11a0 = "maxDescriptorSetStorageImages";
  local_1198 = 0x18;
  local_1194 = 0;
  uStack_118c = 0;
  local_1184 = 1;
  uStack_117c = 0x7cffffffff;
  local_1170 = "maxDescriptorSetInputAttachments";
  local_1158 = 0;
  local_1168 = 0;
  uStack_1160 = 0;
  local_1154 = 0x200000001;
  uStack_114c = 0x80ffffffff;
  local_1140 = "maxVertexInputAttributes";
  local_1138 = 0x10;
  local_1134 = 0;
  uStack_112c = 0;
  local_1124 = 1;
  uStack_111c = 0x84ffffffff;
  local_1110 = "maxVertexInputBindings";
  local_1108 = 0x10;
  local_1104 = 0;
  uStack_10fc = 0;
  local_10f4 = 1;
  uStack_10ec = 0x88ffffffff;
  local_10e0 = "maxVertexInputAttributeOffset";
  local_10d8 = 0x7ff;
  local_10d4 = 0;
  uStack_10cc = 0;
  local_10c4 = 1;
  uStack_10bc = 0x8cffffffff;
  local_10b0 = "maxVertexInputBindingStride";
  local_10a8 = 0x800;
  local_10a4 = 0;
  uStack_109c = 0;
  local_1094 = 1;
  uStack_108c = 0x90ffffffff;
  local_1080 = "maxVertexOutputComponents";
  local_1078 = 0x40;
  local_1074 = 0;
  uStack_106c = 0;
  local_1064 = 1;
  uStack_105c = 0x94ffffffff;
  local_1050 = "maxTessellationGenerationLevel";
  local_1048 = 0x40;
  local_1044 = 0;
  uStack_103c = 0;
  local_1034 = 1;
  uStack_102c = 0x98ffffffff;
  local_1020 = "maxTessellationPatchSize";
  local_1018 = 0x20;
  local_1014 = 0;
  uStack_100c = 0;
  local_1004 = 1;
  uStack_ffc = 0x9cffffffff;
  local_ff0 = "maxTessellationControlPerVertexInputComponents";
  local_fe8 = 0x40;
  local_fe4 = 0;
  uStack_fdc = 0;
  local_fd4 = 1;
  uStack_fcc = 0xa0ffffffff;
  local_fc0 = "maxTessellationControlPerVertexOutputComponents";
  local_fb8 = 0x40;
  local_fb4 = 0;
  uStack_fac = 0;
  local_fa4 = 1;
  uStack_f9c = 0xa4ffffffff;
  local_f90 = "maxTessellationControlPerPatchOutputComponents";
  local_f88 = 0x78;
  local_f84 = 0;
  uStack_f7c = 0;
  local_f74 = 1;
  uStack_f6c = 0xa8ffffffff;
  local_f60 = "maxTessellationControlTotalOutputComponents";
  local_f58 = 0x800;
  local_f54 = 0;
  uStack_f4c = 0;
  local_f44 = 1;
  uStack_f3c = 0xacffffffff;
  local_f30 = "maxTessellationEvaluationInputComponents";
  local_f28 = 0x40;
  local_f24 = 0;
  uStack_f1c = 0;
  local_f14 = 1;
  uStack_f0c = 0xb0ffffffff;
  local_f00 = "maxTessellationEvaluationOutputComponents";
  local_ef8 = 0x40;
  local_ef4 = 0;
  uStack_eec = 0;
  local_ee4 = 1;
  uStack_edc = 0xb4ffffffff;
  local_ed0 = "maxGeometryShaderInvocations";
  local_ec8 = 0x20;
  local_ec4 = 0;
  uStack_ebc = 0;
  local_eb4 = 1;
  uStack_eac = 0xb8ffffffff;
  local_ea0 = "maxGeometryInputComponents";
  local_e98 = 0x40;
  local_e94 = 0;
  uStack_e8c = 0;
  local_e84 = 1;
  uStack_e7c = 0xbcffffffff;
  local_e70 = "maxGeometryOutputComponents";
  local_e68 = 0x40;
  local_e64 = 0;
  uStack_e5c = 0;
  local_e54 = 1;
  uStack_e4c = 0xc0ffffffff;
  local_e40 = "maxGeometryOutputVertices";
  local_e38 = 0x100;
  local_e34 = 0;
  uStack_e2c = 0;
  local_e24 = 1;
  uStack_e1c = 0xc4ffffffff;
  local_e10 = "maxGeometryTotalOutputComponents";
  local_e08 = 0x400;
  local_e04 = 0;
  uStack_dfc = 0;
  local_df4 = 1;
  uStack_dec = 0xc8ffffffff;
  local_de0 = "maxFragmentInputComponents";
  local_dd8 = 0x40;
  local_dd4 = 0;
  uStack_dcc = 0;
  local_dc4 = 1;
  uStack_dbc = 0xccffffffff;
  local_db0 = "maxFragmentOutputAttachments";
  local_da8 = 4;
  local_da4 = 0;
  uStack_d9c = 0;
  local_d94 = 1;
  uStack_d8c = 0xd0ffffffff;
  local_d80 = "maxFragmentDualSrcAttachments";
  local_d78 = 1;
  local_d74 = 0;
  uStack_d6c = 0;
  local_d64 = 1;
  uStack_d5c = 0xd4ffffffff;
  local_d50 = "maxFragmentCombinedOutputResources";
  local_d48 = 4;
  local_d44 = 0;
  uStack_d3c = 0;
  local_d34 = 1;
  uStack_d2c = 0xd8ffffffff;
  local_d20 = "maxComputeSharedMemorySize";
  local_d18 = 0x4000;
  local_d14 = 0;
  uStack_d0c = 0;
  local_d04 = 1;
  uStack_cfc = 0xdcffffffff;
  local_cf0 = "maxComputeWorkGroupCount[0]";
  local_ce8 = 0xffff;
  local_ce4 = 0;
  uStack_cdc = 0;
  local_cd4 = 1;
  uStack_ccc = 0xe0ffffffff;
  local_cc0 = "maxComputeWorkGroupCount[1]";
  local_cb8 = 0xffff;
  local_cb4 = 0;
  uStack_cac = 0;
  local_ca4 = 1;
  uStack_c9c = 0xe4ffffffff;
  local_c90 = "maxComputeWorkGroupCount[2]";
  local_c88 = 0xffff;
  local_c84 = 0;
  uStack_c7c = 0;
  local_c74 = 1;
  uStack_c6c = 0xe8ffffffff;
  local_c60 = "maxComputeWorkGroupInvocations";
  local_c58 = 0x80;
  local_c54 = 0;
  uStack_c4c = 0;
  local_c44 = 1;
  uStack_c3c = 0xecffffffff;
  local_c30 = "maxComputeWorkGroupSize[0]";
  local_c28 = 0x80;
  local_c24 = 0;
  uStack_c1c = 0;
  local_c14 = 1;
  uStack_c0c = 0xf0ffffffff;
  local_c00 = "maxComputeWorkGroupSize[1]";
  local_bf8 = 0x80;
  local_bf4 = 0;
  uStack_bec = 0;
  local_be4 = 1;
  uStack_bdc = 0xf4ffffffff;
  local_bd0 = "maxComputeWorkGroupSize[2]";
  local_bc8 = 0x40;
  local_bc4 = 0;
  uStack_bbc = 0;
  local_bb4 = 1;
  uStack_bac = 0xf8ffffffff;
  local_ba0 = "subPixelPrecisionBits";
  local_b98 = 4;
  local_b94 = 0;
  uStack_b8c = 0;
  local_b84 = 1;
  uStack_b7c = 0xfcffffffff;
  local_b70 = "subTexelPrecisionBits";
  local_b68 = 4;
  local_b64 = 0;
  uStack_b5c = 0;
  local_b54 = 1;
  uStack_b4c = 0x100ffffffff;
  local_b40 = "mipmapPrecisionBits";
  local_b38 = 4;
  local_b34 = 0;
  uStack_b2c = 0;
  local_b24 = 1;
  uStack_b1c = 0x104ffffffff;
  local_b10 = "maxDrawIndexedIndexValue";
  local_b08 = 0xffffffff;
  local_b04 = 0;
  uStack_afc = 0;
  local_af4 = 1;
  uStack_aec = 0x108ffffffff;
  local_ae0 = "maxDrawIndirectCount";
  local_ad8 = 0xffff;
  local_ad4 = 0;
  uStack_acc = 0;
  local_ac4 = 1;
  uStack_abc = 0x10cffffffff;
  local_ab0 = "maxSamplerLodBias";
  local_aa8 = 0;
  uStack_aa0 = 0;
  local_a98 = 0x40000000;
  local_a94 = 2;
  uStack_a8c = 0x110ffffffff;
  local_a80 = "maxSamplerAnisotropy";
  local_a78 = 0;
  uStack_a70 = 0;
  local_a68 = 0x41800000;
  local_a64 = 2;
  uStack_a5c = 0x114ffffffff;
  local_a50 = "maxViewports";
  local_a48 = 0x10;
  local_a44 = 0;
  uStack_a3c = 0;
  local_a34 = 1;
  uStack_a2c = 0x118ffffffff;
  local_a20 = "maxViewportDimensions[0]";
  local_a18 = 0x1000;
  local_a14 = 0;
  uStack_a0c = 0;
  local_a04 = 1;
  uStack_9fc = 0x11cffffffff;
  local_9f0 = "maxViewportDimensions[1]";
  local_9e8 = 0x1000;
  local_9e4 = 0;
  uStack_9dc = 0;
  local_9d4 = 1;
  uStack_9cc = 0x120ffffffff;
  local_9c0 = "viewportBoundsRange[0]";
  local_9b8 = 0;
  uStack_9b0 = 0;
  local_9a8 = 0xc6000000;
  local_9a4 = 0x100000002;
  uStack_99c = 0x124ffffffff;
  local_990 = "viewportBoundsRange[1]";
  local_988 = 0;
  uStack_980 = 0;
  local_978 = 0x45fff800;
  local_974 = 2;
  uStack_96c = 0x128ffffffff;
  local_960 = "viewportSubPixelBits";
  local_948 = 0;
  local_958 = 0;
  uStack_950 = 0;
  local_944 = 1;
  uStack_93c = 0x130ffffffff;
  local_930 = "minMemoryMapAlignment";
  local_928 = 0x40;
  local_924 = 0;
  uStack_91c = 0;
  local_914 = 1;
  uStack_90c = 0x138ffffffff;
  local_900 = "minTexelBufferOffsetAlignment";
  local_8f8 = 0;
  local_8f0 = 1;
  local_8e8 = 0;
  local_8e4 = 3;
  uStack_8dc = 0x138ffffffff;
  local_8d0 = "minTexelBufferOffsetAlignment";
  local_8c8 = 0;
  local_8c0 = 0x100;
  local_8b8 = 0;
  local_8b4 = 0x100000003;
  uStack_8ac = 0x140ffffffff;
  local_8a0 = "minUniformBufferOffsetAlignment";
  local_898 = 0;
  local_890 = 1;
  local_888 = 0;
  local_884 = 3;
  uStack_87c = 0x140ffffffff;
  local_870 = "minUniformBufferOffsetAlignment";
  local_868 = 0;
  local_860 = 0x100;
  local_858 = 0;
  local_854 = 0x100000003;
  uStack_84c = 0x148ffffffff;
  local_840 = "minStorageBufferOffsetAlignment";
  local_838 = 0;
  local_830 = 1;
  local_828 = 0;
  local_824 = 3;
  uStack_81c = 0x148ffffffff;
  local_810 = "minStorageBufferOffsetAlignment";
  local_808 = 0;
  local_800 = 0x100;
  local_7f8 = 0;
  local_7f4 = 0x100000003;
  uStack_7ec = 0x150ffffffff;
  local_7e0 = "minTexelOffset";
  local_7d8 = 0xfffffff800000000;
  local_7d0 = 0;
  uStack_7c8 = 0;
  local_7c0 = 0xffffffff00000001;
  local_7b8 = 0x154;
  local_7b0 = "maxTexelOffset";
  local_7a8 = 7;
  local_7a4 = 0;
  uStack_79c = 0;
  local_794 = 1;
  uStack_78c = 0x158ffffffff;
  local_780 = "minTexelGatherOffset";
  local_778 = 0xfffffff800000000;
  local_770 = 0;
  uStack_768 = 0;
  local_760 = 0xffffffff00000001;
  local_758 = 0x15c;
  local_750 = "maxTexelGatherOffset";
  local_748 = 7;
  local_744 = 0;
  uStack_73c = 0;
  local_734 = 1;
  uStack_72c = 0x160ffffffff;
  local_720 = "minInterpolationOffset";
  local_718 = 0;
  uStack_710 = 0;
  local_708 = 0xbf000000;
  local_704 = 0x100000002;
  uStack_6fc = 0x164ffffffff;
  local_6f0 = "maxInterpolationOffset";
  local_6e8 = 0;
  uStack_6e0 = 0;
  fVar19 = exp2f((float)local_1b28.limits.subPixelInterpolationOffsetBits);
  local_6d8 = -1.0 / fVar19 + 0.5;
  local_6d4 = 2;
  uStack_6cc = 0x168ffffffff;
  local_6c0 = "subPixelInterpolationOffsetBits";
  local_6b8 = 4;
  local_6b4 = 0;
  uStack_6ac = 0;
  local_6a4 = 1;
  uStack_69c = 0x16cffffffff;
  local_690 = "maxFramebufferWidth";
  local_688 = 0x1000;
  local_684 = 0;
  uStack_67c = 0;
  local_674 = 1;
  uStack_66c = 0x170ffffffff;
  local_660 = "maxFramebufferHeight";
  local_658 = 0x1000;
  local_654 = 0;
  uStack_64c = 0;
  local_644 = 1;
  uStack_63c = 0x174ffffffff;
  local_630 = "maxFramebufferLayers";
  local_628 = 0;
  uStack_620 = 0;
  local_618 = 0;
  local_614 = 1;
  uStack_60c = 0x178ffffffff;
  local_600 = "framebufferColorSampleCounts";
  local_5f8 = 5;
  local_5f4 = 0;
  uStack_5ec = 0;
  local_5e4 = 4;
  uStack_5dc = 0x17cffffffff;
  local_5d0 = "framebufferDepthSampleCounts";
  local_5c8 = 5;
  local_5c4 = 0;
  uStack_5bc = 0;
  local_5b4 = 4;
  uStack_5ac = 0x180ffffffff;
  local_5a0 = "framebufferStencilSampleCounts";
  local_598 = 5;
  local_594 = 0;
  uStack_58c = 0;
  local_584 = 4;
  uStack_57c = 0x184ffffffff;
  local_570 = "framebufferNoAttachmentsSampleCounts";
  local_568 = 5;
  local_564 = 0;
  uStack_55c = 0;
  local_554 = 4;
  uStack_54c = 0x188ffffffff;
  local_540 = "maxColorAttachments";
  local_538 = 4;
  local_534 = 0;
  uStack_52c = 0;
  local_524 = 1;
  uStack_51c = 0x18cffffffff;
  local_510 = "sampledImageColorSampleCounts";
  local_508 = 5;
  local_504 = 0;
  uStack_4fc = 0;
  local_4f4 = 4;
  uStack_4ec = 0x190ffffffff;
  local_4e0 = "sampledImageIntegerSampleCounts";
  local_4d8 = 1;
  local_4d4 = 0;
  uStack_4cc = 0;
  local_4c4 = 4;
  uStack_4bc = 0x194ffffffff;
  local_4b0 = "sampledImageDepthSampleCounts";
  local_4a8 = 5;
  local_4a4 = 0;
  uStack_49c = 0;
  local_494 = 4;
  uStack_48c = 0x198ffffffff;
  local_480 = "sampledImageStencilSampleCounts";
  local_478 = 5;
  local_474 = 0;
  uStack_46c = 0;
  local_464 = 4;
  uStack_45c = 0x19cffffffff;
  local_450 = "storageImageSampleCounts";
  local_448 = 5;
  local_444 = 0;
  uStack_43c = 0;
  local_434 = 4;
  uStack_42c = 0x1a0ffffffff;
  local_420 = "maxSampleMaskWords";
  local_418 = 1;
  local_414 = 0;
  uStack_40c = 0;
  local_404 = 1;
  uStack_3fc = 0x1a4ffffffff;
  local_3f0 = "timestampComputeAndGraphics";
  local_3d8 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3d4 = 0x200000001;
  uStack_3cc = 0x1a8ffffffff;
  local_3c0 = "timestampPeriod";
  local_3b8 = 0;
  uStack_3b0 = 0;
  local_3a8 = 0;
  local_3a4 = 0x200000001;
  uStack_39c = 0x1acffffffff;
  local_390 = "maxClipDistances";
  local_388 = 8;
  local_384 = 0;
  uStack_37c = 0;
  local_374 = 1;
  uStack_36c = 0x1b0ffffffff;
  local_360 = "maxCullDistances";
  local_358 = 8;
  local_354 = 0;
  uStack_34c = 0;
  local_344 = 1;
  uStack_33c = 0x1b4ffffffff;
  local_330 = "maxCombinedClipAndCullDistances";
  local_328 = 8;
  local_324 = 0;
  uStack_31c = 0;
  local_314 = 1;
  uStack_30c = 0x1b8ffffffff;
  local_300 = "discreteQueuePriorities";
  local_2f8 = 8;
  local_2f4 = 0;
  uStack_2ec = 0;
  local_2e4 = 0x200000001;
  uStack_2dc = 0x1bcffffffff;
  local_2d0 = "pointSizeRange[0]";
  local_2b8 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2b4 = 2;
  uStack_2ac = 0x1bcffffffff;
  local_2a0 = "pointSizeRange[0]";
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0x3f800000;
  local_284 = 0x100000002;
  uStack_27c = 0x1c0ffffffff;
  local_270 = "pointSizeRange[1]";
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 64.0 - local_1b28.limits.pointSizeGranularity;
  local_254 = 2;
  uStack_24c = 0x1c4ffffffff;
  local_240 = "lineWidthRange[0]";
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0;
  local_224 = 2;
  uStack_21c = 0x1c4ffffffff;
  local_210 = "lineWidthRange[0]";
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = 0x3f800000;
  local_1f4 = 0x100000002;
  uStack_1ec = 0x1c8ffffffff;
  local_1e0 = "lineWidthRange[1]";
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1c8 = 8.0 - local_1b28.limits.lineWidthGranularity;
  local_1c4 = 2;
  uStack_1bc = 0x1ccffffffff;
  local_1b0 = "pointSizeGranularity";
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0x3f800000;
  local_194 = 0x100000002;
  uStack_18c = 0x1d0ffffffff;
  local_180 = "lineWidthGranularity";
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0x3f800000;
  local_164 = 0x100000002;
  uStack_15c = 0x1d4ffffffff;
  local_150 = "strictLines";
  local_138 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_134 = 0x200000001;
  uStack_12c = 0x1d8ffffffff;
  local_120 = "standardSampleLocations";
  local_108 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_104 = 0x200000001;
  uStack_fc = 0x1e0ffffffff;
  local_f0 = "optimalBufferCopyOffsetAlignment";
  local_d8 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d4 = 0x200000003;
  uStack_cc = 0x1e8ffffffff;
  local_c0 = "optimalBufferCopyRowPitchAlignment";
  local_a8 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a4 = 0x200000003;
  uStack_9c = 0x1f0ffffffff;
  local_90 = "nonCoherentAtomSize";
  local_88 = 0;
  local_80 = 1;
  local_78 = 0;
  local_74 = 3;
  uStack_6c = 0x1f0ffffffff;
  local_60 = "nonCoherentAtomSize";
  local_58 = 0;
  local_50 = 0x100;
  local_48 = 0x300000000;
  uStack_40 = 0xffffffff00000001;
  poVar1 = (ostringstream *)(local_1ca8 + 8);
  local_1ca8._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  ::vk::operator<<((ostream *)poVar1,&local_1b28.limits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1ca8 + 0x78));
  lVar10 = 0;
  do {
    piVar18 = &DAT_00cef930;
    lVar17 = 0;
    do {
      if (*piVar18 == *(int *)(local_16e8 + lVar10 * 0x30)) {
        aiStack_16bc[lVar10 * 0xc] = (int)lVar17;
        break;
      }
      lVar17 = lVar17 + 1;
      piVar18 = piVar18 + 0xc;
    } while (lVar17 != 0x22);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x79);
  bVar7 = true;
  lVar10 = 0;
  do {
    iVar5 = (int)poVar1;
    switch(*(undefined4 *)((long)&local_16c4 + lVar10)) {
    case 0:
      iVar13 = *(int *)((long)&local_16d8.m_log + lVar10 + 4);
      if (((long)*(int *)((long)aiStack_16bc + lVar10) != -1) &&
         (lVar17 = (long)*(int *)((long)aiStack_16bc + lVar10) * 0x30,
         *(int *)((long)local_17c4 + (ulong)*(uint *)(&UNK_00cef940 + lVar17)) == 0)) {
        iVar13 = *(int *)(&UNK_00cef948 + lVar17);
      }
      iVar2 = *(int *)((long)&local_16c4 + lVar10 + 4);
      if (iVar2 == 1) {
        if (iVar13 < *(int *)(local_1b28.pipelineCacheUUID +
                             (ulong)*(uint *)(local_16e8 + lVar10) + 0x14)) {
          local_1ca8._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"limit validation failed, ",0x19);
          pcVar4 = *(char **)((long)&local_16e0 + lVar10);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
          }
          else {
            sVar11 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," not valid-limit type MAX actual is ",0x24);
          std::ostream::operator<<
                    (poVar1,*(int *)(local_1b28.pipelineCacheUUID +
                                    (ulong)*(uint *)(local_16e8 + lVar10) + 0x14));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00417814;
        }
      }
      else if ((iVar2 == 0) &&
              (*(int *)(local_1b28.pipelineCacheUUID + (ulong)*(uint *)(local_16e8 + lVar10) + 0x14)
               < iVar13)) {
        local_1ca8._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"limit validation failed, ",0x19);
        pcVar4 = *(char **)((long)&local_16e0 + lVar10);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
        }
        else {
          sVar11 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," not valid-limit type MIN actual is ",0x24);
        std::ostream::operator<<
                  (poVar1,*(int *)(local_1b28.pipelineCacheUUID +
                                  (ulong)*(uint *)(local_16e8 + lVar10) + 0x14));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00417814:
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1ca8 + 0x78));
        goto LAB_0041782c;
      }
      break;
    case 1:
      uVar14 = *(uint *)((long)&local_16d8.m_log + lVar10);
      if (((long)*(int *)((long)aiStack_16bc + lVar10) != -1) &&
         (lVar17 = (long)*(int *)((long)aiStack_16bc + lVar10) * 0x30,
         *(int *)((long)local_17c4 + (ulong)*(uint *)(&UNK_00cef940 + lVar17)) == 0)) {
        uVar14 = *(uint *)(&UNK_00cef944 + lVar17);
      }
      iVar13 = *(int *)((long)&local_16c4 + lVar10 + 4);
      if (iVar13 == 1) {
        if (uVar14 < *(uint *)(local_1b28.pipelineCacheUUID +
                              (ulong)*(uint *)(local_16e8 + lVar10) + 0x14)) {
          local_1ca8._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"limit validation failed,  ",0x1a);
          pcVar4 = *(char **)((long)&local_16e0 + lVar10);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
          }
          else {
            sVar11 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," not valid-limit type MAX - actual is ",0x26);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00417814;
        }
      }
      else if ((iVar13 == 0) &&
              (*(uint *)(local_1b28.pipelineCacheUUID + (ulong)*(uint *)(local_16e8 + lVar10) + 0x14
                        ) < uVar14)) {
        local_1ca8._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"limit Validation failed ",0x18);
        pcVar4 = *(char **)((long)&local_16e0 + lVar10);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
        }
        else {
          sVar11 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," not valid-limit type MIN - actual is ",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00417814;
      }
      break;
    case 2:
      fVar19 = *(float *)((long)&uStack_16cc + lVar10 + 4);
      if (((long)*(int *)((long)aiStack_16bc + lVar10) != -1) &&
         (lVar17 = (long)*(int *)((long)aiStack_16bc + lVar10) * 0x30,
         *(int *)((long)local_17c4 + (ulong)*(uint *)(&UNK_00cef940 + lVar17)) == 0)) {
        fVar19 = *(float *)(&UNK_00cef958 + lVar17);
      }
      iVar13 = *(int *)((long)&local_16c4 + lVar10 + 4);
      if (iVar13 == 1) {
        if (fVar19 < *(float *)(local_1b28.pipelineCacheUUID +
                               (ulong)*(uint *)(local_16e8 + lVar10) + 0x14)) {
          local_1ca8._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"limit validation failed, ",0x19);
          pcVar4 = *(char **)((long)&local_16e0 + lVar10);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
          }
          else {
            sVar11 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," not valid-limit type MAX actual is ",0x24);
          std::ostream::_M_insert<double>
                    ((double)*(float *)(local_1b28.pipelineCacheUUID +
                                       (ulong)*(uint *)(local_16e8 + lVar10) + 0x14));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00417814;
        }
      }
      else if ((iVar13 == 0) &&
              (*(float *)(local_1b28.pipelineCacheUUID +
                         (ulong)*(uint *)(local_16e8 + lVar10) + 0x14) <= fVar19 &&
               fVar19 != *(float *)(local_1b28.pipelineCacheUUID +
                                   (ulong)*(uint *)(local_16e8 + lVar10) + 0x14))) {
        local_1ca8._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"limit validation failed, ",0x19);
        pcVar4 = *(char **)((long)&local_16e0 + lVar10);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
        }
        else {
          sVar11 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," not valid-limit type MIN - actual is ",0x26);
        std::ostream::_M_insert<double>
                  ((double)*(float *)(local_1b28.pipelineCacheUUID +
                                     (ulong)*(uint *)(local_16e8 + lVar10) + 0x14));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00417814;
      }
      break;
    case 3:
      uVar15 = *(ulong *)((long)&uStack_16d0 + lVar10);
      if (((long)*(int *)((long)aiStack_16bc + lVar10) != -1) &&
         (lVar17 = (long)*(int *)((long)aiStack_16bc + lVar10) * 0x30,
         *(int *)((long)local_17c4 + (ulong)*(uint *)(&UNK_00cef940 + lVar17)) == 0)) {
        uVar15 = *(ulong *)(&UNK_00cef950 + lVar17);
      }
      iVar13 = *(int *)((long)&local_16c4 + lVar10 + 4);
      if (iVar13 == 1) {
        if (uVar15 < *(ulong *)(local_1b28.pipelineCacheUUID +
                               (ulong)*(uint *)(local_16e8 + lVar10) + 0x14)) {
          local_1ca8._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"limit validation failed, ",0x19);
          pcVar4 = *(char **)((long)&local_16e0 + lVar10);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
          }
          else {
            sVar11 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," not valid-limit type MAX actual is ",0x24);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00417814;
        }
      }
      else if ((iVar13 == 0) &&
              (*(ulong *)(local_1b28.pipelineCacheUUID +
                         (ulong)*(uint *)(local_16e8 + lVar10) + 0x14) < uVar15)) {
        local_1ca8._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"limit validation failed, ",0x19);
        pcVar4 = *(char **)((long)&local_16e0 + lVar10);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
        }
        else {
          sVar11 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," not valid-limit type MIN actual is ",0x24);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00417814;
      }
      break;
    case 4:
      uVar14 = *(uint *)((long)&local_16d8.m_log + lVar10);
      if (((long)*(int *)((long)aiStack_16bc + lVar10) != -1) &&
         (lVar17 = (long)*(int *)((long)aiStack_16bc + lVar10) * 0x30,
         *(int *)((long)local_17c4 + (ulong)*(uint *)(&UNK_00cef940 + lVar17)) == 0)) {
        uVar14 = *(uint *)(&UNK_00cef944 + lVar17);
      }
      if ((*(int *)((long)&local_16c4 + lVar10 + 4) == 0) &&
         ((uVar14 & ~*(uint *)(local_1b28.pipelineCacheUUID +
                              (ulong)*(uint *)(local_16e8 + lVar10) + 0x14)) != 0)) {
        local_1ca8._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"limit validation failed, ",0x19);
        pcVar4 = *(char **)((long)&local_16e0 + lVar10);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)*(undefined8 *)(local_1ca8._8_8_ + -0x18));
        }
        else {
          sVar11 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," not valid-limit type bitmask actual is ",0x28);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00417814;
      }
      break;
    default:
LAB_0041782c:
      bVar7 = false;
    }
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0x16b0);
  poVar1 = (ostringstream *)(local_1ca8 + 8);
  lVar10 = 0;
  bVar6 = true;
  do {
    bVar16 = bVar6;
    if (local_1b28.limits.maxViewportDimensions[lVar10] < local_1b28.limits.maxImageDimension2D) {
      local_1ca8._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"limit validation failed, maxImageDimension2D of ",0x30);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"is larger than maxViewportDimension[",0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] of ",5);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1ca8 + 0x78));
      bVar7 = false;
    }
    lVar10 = 1;
    bVar6 = false;
  } while (bVar16);
  if (local_1b28.limits.viewportBoundsRange[0] <=
      (float)(local_1b28.limits.maxViewportDimensions[0] * -2)) {
    if (local_1b28.limits.viewportBoundsRange[1] <
        (float)(local_1b28.limits.maxViewportDimensions[1] * 2 - 1)) goto LAB_00417a2e;
    if (bVar7) {
      lVar10 = 0;
      do {
        if (acStack_17f0[lVar10] != -0x33) {
          local_16e8 = (undefined1  [8])pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_16e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_16e0,"deviceProperties - Guard offset ",0x20);
          std::ostream::operator<<((ostringstream *)&local_16e0,(int)lVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_16e0," not valid",10)
          ;
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_16e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_16e0);
          std::ios_base::~ios_base((ios_base *)((long)&local_1674 + 4));
          local_16e8 = (undefined1  [8])&local_16d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_16e8,"deviceProperties buffer overflow","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_16e8,
                     (char *)((long)(qpTestLog **)local_16e8 + (long)local_16e0));
          goto LAB_00417c3e;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      pVVar9 = Context::getPhysicalDevice(context);
      pIVar8 = Context::getInstanceInterface(context);
      bVar7 = ::vk::ValidateQueryBits::
              validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceProperties>
                        ((ValidateQueryBits *)pVVar9,(VkPhysicalDevice_s *)0x29,0,pIVar8,
                         (QueryMemberTableEntry *)
                         &api::(anonymous_namespace)::s_physicalDevicePropertiesOffsetTable);
      if (bVar7) {
        sVar12 = deStrnlen(local_1b28.deviceName,0x100);
        if (sVar12 == 0x100) {
          local_16e8 = (undefined1  [8])pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_16e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_16e0,
                     "deviceProperties - VkPhysicalDeviceProperties deviceName not properly initialized"
                     ,0x51);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_16e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_16e0);
          std::ios_base::~ios_base((ios_base *)((long)&local_1674 + 4));
          local_16e8 = (undefined1  [8])&local_16d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_16e8,"deviceProperties incomplete initialization","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_16e8,
                     (char *)((long)(qpTestLog **)local_16e8 + (long)local_16e0));
        }
        else {
          AVar20 = ::vk::unpackVersion(local_1b28.apiVersion);
          AVar21 = ::vk::unpackVersion(0x400000);
          if (AVar20.majorNum == AVar21.majorNum) {
            if (AVar21._0_8_ >> 0x20 < AVar20._0_8_ >> 0x20) {
              local_16e8 = (undefined1  [8])pTVar3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_16e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_16e0,"deviceProperties - API Minor Version ",0x25);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_16e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_16e0," is not valid for this version of dEQP",0x26);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_16e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_16e0);
              std::ios_base::~ios_base((ios_base *)((long)&local_1674 + 4));
              local_16e8 = (undefined1  [8])&local_16d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_16e8,"deviceProperties apiVersion not valid","");
              __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
              (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->m_description,local_16e8,
                         (char *)((long)(qpTestLog **)local_16e8 + (long)local_16e0));
            }
            else {
              local_16e8 = (undefined1  [8])&local_16d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_16e8,"DeviceProperites query succeeded","");
              __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
              (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->m_description,local_16e8,
                         (char *)((long)(qpTestLog **)local_16e8 + (long)local_16e0));
            }
          }
          else {
            local_16e8 = (undefined1  [8])pTVar3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_16e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_16e0,"deviceProperties - API Major Version ",0x25);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_16e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_16e0," is not valid",0xd);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_16e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_16e0);
            std::ios_base::~ios_base((ios_base *)((long)&local_1674 + 4));
            local_16e8 = (undefined1  [8])&local_16d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_16e8,"deviceProperties apiVersion not valid","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,local_16e8,
                       (char *)((long)(qpTestLog **)local_16e8 + (long)local_16e0));
          }
        }
      }
      else {
        local_16e8 = (undefined1  [8])pTVar3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_16e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_16e0,
                   "deviceProperties - VkPhysicalDeviceProperties not completely initialized",0x48);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_16e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_16e0);
        std::ios_base::~ios_base((ios_base *)((long)&local_1674 + 4));
        local_16e8 = (undefined1  [8])&local_16d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_16e8,"deviceProperties incomplete initialization","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_16e8,
                   (char *)((long)(qpTestLog **)local_16e8 + (long)local_16e0));
      }
      goto LAB_00417c3e;
    }
  }
  else {
    poVar1 = (ostringstream *)(local_1ca8 + 8);
    local_1ca8._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"limit validation failed, viewPortBoundsRange[0] of ",0x33);
    std::ostream::_M_insert<double>((double)local_1b28.limits.viewportBoundsRange[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"is larger than -2*maxViewportDimension[0] of ",0x2d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1ca8 + 0x78));
    if (local_1b28.limits.viewportBoundsRange[1] <
        (float)(local_1b28.limits.maxViewportDimensions[1] * 2 - 1)) {
LAB_00417a2e:
      poVar1 = (ostringstream *)(local_1ca8 + 8);
      local_1ca8._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"limit validation failed, viewportBoundsRange[1] of ",0x33);
      std::ostream::_M_insert<double>((double)local_1b28.limits.viewportBoundsRange[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"is less than 2*maxViewportDimension[1] of ",0x2a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1ca8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1ca8 + 0x78));
    }
  }
  local_16e8 = (undefined1  [8])&local_16d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e8,"deviceProperties - feature limits failed","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_16e8,
             (char *)((long)(qpTestLog **)local_16e8 + (long)local_16e0));
LAB_00417c3e:
  if (local_16e8 != (undefined1  [8])&local_16d8) {
    operator_delete((void *)local_16e8,CONCAT44(local_16d8.m_log._4_4_,local_16d8.m_log._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceProperties (Context& context)
{
	using namespace ValidateQueryBits;

	TestLog&						log			= context.getTestContext().getLog();
	VkPhysicalDeviceProperties*		props;
	VkPhysicalDeviceFeatures		features;
	deUint8							buffer[sizeof(VkPhysicalDeviceProperties) + GUARD_SIZE];

	props = reinterpret_cast<VkPhysicalDeviceProperties*>(buffer);
	deMemset(props, GUARD_VALUE, sizeof(buffer));

	context.getInstanceInterface().getPhysicalDeviceProperties(context.getPhysicalDevice(), props);
	context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), &features);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *props << TestLog::EndMessage;

	if (!validateFeatureLimits(props, &features, log))
		return tcu::TestStatus::fail("deviceProperties - feature limits failed");

	for (int ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceProperties)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceProperties - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties buffer overflow");
		}
	}

	if (!validateInitComplete(context.getPhysicalDevice(), &InstanceInterface::getPhysicalDeviceProperties, context.getInstanceInterface(), s_physicalDevicePropertiesOffsetTable))
	{
		log << TestLog::Message << "deviceProperties - VkPhysicalDeviceProperties not completely initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceProperties incomplete initialization");
	}

	// Check if deviceName string is properly terminated.
	if (deStrnlen(props->deviceName, VK_MAX_PHYSICAL_DEVICE_NAME_SIZE) == VK_MAX_PHYSICAL_DEVICE_NAME_SIZE)
	{
		log << TestLog::Message << "deviceProperties - VkPhysicalDeviceProperties deviceName not properly initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceProperties incomplete initialization");
	}

	{
		const ApiVersion deviceVersion = unpackVersion(props->apiVersion);
		const ApiVersion deqpVersion = unpackVersion(VK_API_VERSION);

		if (deviceVersion.majorNum != deqpVersion.majorNum)
		{
			log << TestLog::Message << "deviceProperties - API Major Version " << deviceVersion.majorNum << " is not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties apiVersion not valid");
		}

		if (deviceVersion.minorNum > deqpVersion.minorNum)
		{
			log << TestLog::Message << "deviceProperties - API Minor Version " << deviceVersion.minorNum << " is not valid for this version of dEQP" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties apiVersion not valid");
		}
	}

	return tcu::TestStatus::pass("DeviceProperites query succeeded");
}